

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

void __thiscall
ON_3dmAnnotationSettings::EnableUseDimensionLayer
          (ON_3dmAnnotationSettings *this,bool use_dimension_layer)

{
  ON_3dmAnnotationSettingsPrivate *pOVar1;
  ON_3dmAnnotationSettingsPrivate *pOVar2;
  
  if (this != &Default) {
    pOVar1 = this->m_private;
    pOVar2 = &Default3dmAnnotationSettingsPrivate;
    if (pOVar1 != (ON_3dmAnnotationSettingsPrivate *)0x0) {
      pOVar2 = pOVar1;
    }
    if (pOVar2->m_use_dimension_layer != use_dimension_layer) {
      if (pOVar1 == (ON_3dmAnnotationSettingsPrivate *)0x0) {
        pOVar1 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
        pOVar1->m_world_view_text_scale = 0.0;
        pOVar1->m_world_view_hatch_scale = 0.0;
        pOVar1->m_use_dimension_layer = false;
        *(undefined3 *)&pOVar1->field_0x9 = 0;
        (pOVar1->m_dimension_layer_id).Data1 = 0;
        pOVar1->m_world_view_text_scale = 1.0;
        pOVar1->m_world_view_hatch_scale = 1.0;
        (pOVar1->m_dimension_layer_id).Data1 = 0;
        (pOVar1->m_dimension_layer_id).Data2 = 0;
        (pOVar1->m_dimension_layer_id).Data3 = 0;
        (pOVar1->m_dimension_layer_id).Data4[0] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[1] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[2] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[3] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[4] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[5] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[6] = '\0';
        (pOVar1->m_dimension_layer_id).Data4[7] = '\0';
        this->m_private = pOVar1;
      }
      pOVar1->m_use_dimension_layer = use_dimension_layer;
    }
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::EnableUseDimensionLayer(bool use_dimension_layer)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (UseDimensionLayer() != use_dimension_layer)
  {
    if (nullptr == m_private)
      m_private = new ON_3dmAnnotationSettingsPrivate();
    m_private->m_use_dimension_layer = use_dimension_layer;
  }
}